

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-type.c
# Opt level: O0

coda_grib_value_array *
coda_grib_value_array_simple_packing_new
          (coda_type_array *definition,long num_elements,int64_t byte_offset,int element_bit_size,
          int16_t decimalScaleFactor,int16_t binaryScaleFactor,float referenceValue,uint8_t *bitmask
          )

{
  byte bVar1;
  size_t __size;
  uint8_t *puVar2;
  double dVar3;
  double dVar4;
  long lStack_50;
  uint8_t bm;
  long i;
  long bitmask_size;
  coda_grib_value_array *type;
  float referenceValue_local;
  int16_t binaryScaleFactor_local;
  int16_t decimalScaleFactor_local;
  int element_bit_size_local;
  int64_t byte_offset_local;
  long num_elements_local;
  coda_type_array *definition_local;
  
  definition_local =
       (coda_type_array *)coda_grib_value_array_new(definition,num_elements,byte_offset);
  if (definition_local == (coda_type_array *)0x0) {
    definition_local = (coda_type_array *)0x0;
  }
  else {
    *(int *)&definition_local->size_expr = 1;
    *(int *)((long)&definition_local->size_expr + 4) = element_bit_size;
    *(int16_t *)&definition_local->attributes = decimalScaleFactor;
    *(int16_t *)((long)&definition_local->attributes + 2) = binaryScaleFactor;
    *(float *)((long)&definition_local->attributes + 4) = referenceValue;
    dVar3 = fpow(2,(long)binaryScaleFactor);
    dVar4 = fpow(10,(long)-(int)decimalScaleFactor);
    definition_local->base_type = (coda_type *)(dVar3 * dVar4);
    dVar3 = fpow(10,(long)-(int)decimalScaleFactor);
    definition_local->num_elements = (long)((double)referenceValue * dVar3);
    *(uint8_t **)&definition_local->num_dims = (uint8_t *)0x0;
    definition_local->dim[0] = 0;
    if (bitmask != (uint8_t *)0x0) {
      __size = (num_elements >> 3) + (long)(int)(uint)((num_elements & 7U) != 0);
      puVar2 = (uint8_t *)malloc(__size);
      *(uint8_t **)&definition_local->num_dims = puVar2;
      if (*(uint8_t **)&definition_local->num_dims == (uint8_t *)0x0) {
        coda_grib_type_delete((coda_dynamic_type *)definition_local);
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-type.c"
                       ,0xad);
        definition_local = (coda_type_array *)0x0;
      }
      else {
        memcpy(*(uint8_t **)&definition_local->num_dims,bitmask,__size);
        puVar2 = (uint8_t *)malloc(__size);
        definition_local->dim[0] = (long)puVar2;
        if ((uint8_t *)definition_local->dim[0] == (uint8_t *)0x0) {
          coda_grib_type_delete((coda_dynamic_type *)definition_local);
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-type.c"
                         ,0xb7);
          definition_local = (coda_type_array *)0x0;
        }
        else {
          for (lStack_50 = 0; lStack_50 < (long)__size; lStack_50 = lStack_50 + 1) {
            bVar1 = (*(uint8_t **)&definition_local->num_dims)[lStack_50];
            ((uint8_t *)definition_local->dim[0])[lStack_50] =
                 (char)((int)(uint)bVar1 >> 7) + ((byte)((int)(uint)bVar1 >> 6) & 1) +
                 ((byte)((int)(uint)bVar1 >> 5) & 1) + ((byte)((int)(uint)bVar1 >> 4) & 1) +
                 ((byte)((int)(uint)bVar1 >> 3) & 1) + ((byte)((int)(uint)bVar1 >> 2) & 1) +
                 ((byte)((int)(uint)bVar1 >> 1) & 1) + (bVar1 & 1);
            if (lStack_50 % 0x10 != 0) {
              ((uint8_t *)definition_local->dim[0])[lStack_50] =
                   ((uint8_t *)definition_local->dim[0])[lStack_50] +
                   ((uint8_t *)definition_local->dim[0])[lStack_50 + -1];
            }
          }
        }
      }
    }
  }
  return (coda_grib_value_array *)definition_local;
}

Assistant:

coda_grib_value_array *coda_grib_value_array_simple_packing_new(coda_type_array *definition, long num_elements,
                                                                int64_t byte_offset, int element_bit_size,
                                                                int16_t decimalScaleFactor, int16_t binaryScaleFactor,
                                                                float referenceValue, const uint8_t *bitmask)
{
    coda_grib_value_array *type;
    long bitmask_size;
    long i;

    type = coda_grib_value_array_new(definition, num_elements, byte_offset);
    if (type == NULL)
    {
        return NULL;
    }

    type->simple_packing = 1;
    type->element_bit_size = element_bit_size;
    type->decimalScaleFactor = decimalScaleFactor;
    type->binaryScaleFactor = binaryScaleFactor;
    type->referenceValue = referenceValue;
    type->scalefactor = fpow(2, binaryScaleFactor) * fpow(10, -decimalScaleFactor);
    type->offset = referenceValue * fpow(10, -decimalScaleFactor);
    type->bitmask = NULL;
    type->bitmask_cumsum128 = NULL;

    if (bitmask != NULL)
    {
        bitmask_size = bit_size_to_byte_size(num_elements);
        type->bitmask = (uint8_t *)malloc(bitmask_size * sizeof(uint8_t));
        if (type->bitmask == NULL)
        {
            coda_grib_type_delete((coda_dynamic_type *)type);
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(bitmask_size * sizeof(uint8_t)), __FILE__, __LINE__);
            return NULL;
        }
        memcpy(type->bitmask, bitmask, bitmask_size);

        type->bitmask_cumsum128 = (uint8_t *)malloc(bitmask_size * sizeof(uint8_t));
        if (type->bitmask_cumsum128 == NULL)
        {
            coda_grib_type_delete((coda_dynamic_type *)type);
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(bitmask_size * sizeof(uint8_t)), __FILE__, __LINE__);
            return NULL;
        }
        for (i = 0; i < bitmask_size; i++)
        {
            uint8_t bm = type->bitmask[i];

            type->bitmask_cumsum128[i] = ((bm >> 7) & 1) + ((bm >> 6) & 1) + ((bm >> 5) & 1) + ((bm >> 4) & 1) +
                ((bm >> 3) & 1) + ((bm >> 2) & 1) + ((bm >> 1) & 1) + (bm & 1);
            if (i % 16 != 0)
            {
                type->bitmask_cumsum128[i] += type->bitmask_cumsum128[i - 1];
            }
        }
    }

    return type;
}